

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.h
# Opt level: O2

string * __thiscall
ZXing::SymbologyIdentifier::toString_abi_cxx11_
          (string *__return_storage_ptr__,SymbologyIdentifier *this,bool hasECI)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->code == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_60,'\x01');
    std::operator+(&local_40,']',&local_60);
    cVar1 = '\0';
    if (hasECI) {
      cVar1 = this->eciModifierOffset;
    }
    std::operator+(__return_storage_ptr__,&local_40,cVar1 + this->modifier);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString(bool hasECI = false) const
	{
		return code ? ']' + std::string(1, code) + static_cast<char>(modifier + eciModifierOffset * hasECI) : std::string();
	}